

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

ProFunctionDef * __thiscall ProFunctionDef::operator=(ProFunctionDef *this,ProFunctionDef *other)

{
  ProFunctionDef *in_RSI;
  ProFunctionDef *in_RDI;
  long in_FS_OFFSET;
  ProFunctionDef moved;
  ProFunctionDef *this_00;
  ProFunctionDef local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_pro = (ProFile *)0xaaaaaaaaaaaaaaaa;
  local_18.m_offset = -0x55555556;
  local_18._12_4_ = 0xaaaaaaaa;
  this_00 = &local_18;
  ProFunctionDef(this_00,in_RSI);
  swap(this_00,in_RDI);
  ~ProFunctionDef(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ProFunctionDef &operator=(ProFunctionDef &&other) noexcept
    {
        ProFunctionDef moved(std::move(other));
        swap(moved);
        return *this;
    }